

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_unicode.c
# Opt level: O3

int PHYSFS_caseFold(PHYSFS_uint32 from,PHYSFS_uint32 *to)

{
  undefined4 uVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  
  if (from < 0x80) {
    uVar3 = from | 0x20;
    if (0x19 < from - 0x41) {
      uVar3 = from;
    }
    *to = uVar3;
  }
  else {
    uVar3 = from >> 8 ^ from;
    if (from < 0x10000) {
      uVar4 = (ulong)((uVar3 & 0xff) << 4);
      if ((ulong)(&case_fold_hash1_16[0].count)[uVar4] != 0) {
        lVar2 = *(long *)((long)&case_fold_hash1_16[0].list + uVar4);
        uVar6 = 0;
        do {
          if (*(ushort *)(lVar2 + uVar6 * 4) == from) {
            uVar3 = (uint)*(ushort *)(lVar2 + 2 + uVar6 * 4);
LAB_0010b74c:
            *to = uVar3;
            return 1;
          }
          uVar6 = uVar6 + 1;
        } while ((&case_fold_hash1_16[0].count)[uVar4] != uVar6);
      }
      uVar4 = (ulong)((uVar3 & 0xf) << 4);
      if ((&case_fold_hash2_16[0].count)[uVar4] != 0) {
        lVar2 = *(long *)((long)&case_fold_hash2_16[0].list + uVar4);
        lVar5 = 0;
        do {
          if (*(ushort *)(lVar2 + lVar5) == from) {
            uVar1 = *(undefined4 *)(lVar2 + 2 + lVar5);
            *(ulong *)to = (ulong)(CONCAT24((short)((uint)uVar1 >> 0x10),uVar1) & 0xffff0000ffff);
            return 2;
          }
          lVar5 = lVar5 + 6;
        } while ((ulong)((uint)(&case_fold_hash2_16[0].count)[uVar4] * 2) * 3 != lVar5);
      }
      uVar4 = (ulong)((uVar3 & 3) << 4);
      if ((ulong)(&case_fold_hash3_16[0].count)[uVar4] != 0) {
        lVar2 = *(long *)((long)&case_fold_hash3_16[0].list + uVar4);
        uVar6 = 0;
        do {
          if (*(ushort *)(lVar2 + uVar6 * 8) == from) {
            uVar1 = *(undefined4 *)(lVar2 + 2 + uVar6 * 8);
            *(ulong *)to = (ulong)(CONCAT24((short)((uint)uVar1 >> 0x10),uVar1) & 0xffff0000ffff);
            to[2] = (uint)*(ushort *)(lVar2 + 6 + uVar6 * 8);
            return 3;
          }
          uVar6 = uVar6 + 1;
        } while ((&case_fold_hash3_16[0].count)[uVar4] != uVar6);
      }
    }
    else {
      uVar4 = (ulong)((uVar3 & 0xf) << 4);
      if ((ulong)(&case_fold_hash1_32[0].count)[uVar4] != 0) {
        lVar2 = *(long *)((long)&case_fold_hash1_32[0].list + uVar4);
        uVar6 = 0;
        do {
          if (*(PHYSFS_uint32 *)(lVar2 + uVar6 * 8) == from) {
            uVar3 = *(uint *)(lVar2 + 4 + uVar6 * 8);
            goto LAB_0010b74c;
          }
          uVar6 = uVar6 + 1;
        } while ((&case_fold_hash1_32[0].count)[uVar4] != uVar6);
      }
    }
    *to = from;
  }
  return 1;
}

Assistant:

int PHYSFS_caseFold(const PHYSFS_uint32 from, PHYSFS_uint32 *to)
{
    int i;

    if (from < 128)  /* low-ASCII, easy! */
    {
        if ((from >= 'A') && (from <= 'Z'))
            *to = from - ('A' - 'a');
        else
            *to = from;
        return 1;
    } /* if */

    else if (from <= 0xFFFF)
    {
        const PHYSFS_uint8 hash = ((from ^ (from >> 8)) & 0xFF);
        const PHYSFS_uint16 from16 = (PHYSFS_uint16) from;

        {
            const CaseFoldHashBucket1_16 *bucket = &case_fold_hash1_16[hash];
            const int count = (int) bucket->count;
            for (i = 0; i < count; i++)
            {
                const CaseFoldMapping1_16 *mapping = &bucket->list[i];
                if (mapping->from == from16)
                {
                    *to = mapping->to0;
                    return 1;
                } /* if */
            } /* for */
        }

        {
            const CaseFoldHashBucket2_16 *bucket = &case_fold_hash2_16[hash & 15];
            const int count = (int) bucket->count;
            for (i = 0; i < count; i++)
            {
                const CaseFoldMapping2_16 *mapping = &bucket->list[i];
                if (mapping->from == from16)
                {
                    to[0] = mapping->to0;
                    to[1] = mapping->to1;
                    return 2;
                } /* if */
            } /* for */
        }

        {
            const CaseFoldHashBucket3_16 *bucket = &case_fold_hash3_16[hash & 3];
            const int count = (int) bucket->count;
            for (i = 0; i < count; i++)
            {
                const CaseFoldMapping3_16 *mapping = &bucket->list[i];
                if (mapping->from == from16)
                {
                    to[0] = mapping->to0;
                    to[1] = mapping->to1;
                    to[2] = mapping->to2;
                    return 3;
                } /* if */
            } /* for */
        }
    } /* else if */

    else  /* codepoint that doesn't fit in 16 bits. */
    {
        const PHYSFS_uint8 hash = ((from ^ (from >> 8)) & 0xFF);
        const CaseFoldHashBucket1_32 *bucket = &case_fold_hash1_32[hash & 15];
        const int count = (int) bucket->count;
        for (i = 0; i < count; i++)
        {
            const CaseFoldMapping1_32 *mapping = &bucket->list[i];
            if (mapping->from == from)
            {
                *to = mapping->to0;
                return 1;
            } /* if */
        } /* for */
    } /* else */


    /* Not found...there's no remapping for this codepoint. */
    *to = from;
    return 1;
}